

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dark_magic.h
# Opt level: O0

void cplus::memory::swap<int>(int *a,int *b)

{
  long local_30;
  size_t swapTime;
  char *swapB;
  char *swapA;
  int *b_local;
  int *a_local;
  
  swapTime = (size_t)b;
  swapB = (char *)a;
  for (local_30 = 4; local_30 != 0; local_30 = local_30 + -1) {
    *swapB = *swapB ^ *(byte *)swapTime;
    *(byte *)swapTime = *swapB ^ *(byte *)swapTime;
    *swapB = *swapB ^ *(byte *)swapTime;
    swapB = swapB + 1;
    swapTime = swapTime + 1;
  }
  return;
}

Assistant:

void swap(const T &a, const T &b) {
			char *swapA = (char *) &a;
			char *swapB = (char *) &b;
			for (size_t swapTime = sizeof(a); swapTime > 0; swapTime--) {
				(*swapA) = (*swapA) ^ (*swapB);
				(*swapB) = (*swapA) ^ *(swapB);
				(*swapA) = (*swapA) ^ *(swapB);
				++swapA;
				++swapB;
			}
		}